

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::NumberToStr_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Value *num)

{
  double dVar1;
  allocator local_51;
  double local_50;
  char temp [64];
  
  if (*(int *)(this + 8) == 2) {
    local_50 = *(double *)this;
    dVar1 = floor(local_50);
    if ((dVar1 != local_50) || (NAN(dVar1) || NAN(local_50))) {
      snprintf(temp,0x40,"%g");
    }
    else {
      snprintf(temp,0x40,"%lld",(long)local_50);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,temp,&local_51);
    return __return_storage_ptr__;
  }
  __assert_fail("num->type_ == luna::ValueT_Number",
                "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",0xe,
                "std::string (anonymous namespace)::NumberToStr(luna::Value *)");
}

Assistant:

std::string NumberToStr(luna::Value *num)
    {
        assert(num->type_ == luna::ValueT_Number);
        char temp[64];
        if (floor(num->num_) == num->num_)
            snprintf(temp, sizeof(temp), "%lld", static_cast<long long>(num->num_));
        else
            snprintf(temp, sizeof(temp), "%g", num->num_);
        return temp;
    }